

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O3

void whisper_kv_cache_seq_rm
               (whisper_kv_cache *cache,whisper_seq_id seq_id,whisper_pos p0,whisper_pos p1)

{
  _Base_ptr p_Var1;
  uint uVar2;
  pointer pwVar3;
  int iVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  ulong uVar7;
  uint uVar8;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar9;
  int local_34;
  
  uVar2 = cache->size;
  iVar4 = 0;
  if (0 < p0) {
    iVar4 = p0;
  }
  if (uVar2 != 0) {
    pwVar3 = (cache->cells).super__Vector_base<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar7 = 0;
    uVar8 = uVar2;
    local_34 = seq_id;
    do {
      if (pwVar3[uVar7].pos != 0x7fffffff && iVar4 <= pwVar3[uVar7].pos) {
        if (local_34 < 0) {
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                    (&pwVar3[uVar7].seq_id._M_t);
LAB_00132122:
          pwVar3 = (cache->cells).
                   super__Vector_base<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar2 = cache->size;
          if (*(size_t *)((long)&pwVar3[uVar7].seq_id._M_t._M_impl + 0x28) == 0) {
            pwVar3[uVar7].pos = -1;
            if (uVar8 == uVar2) {
              uVar8 = (uint)uVar7;
            }
          }
        }
        else {
          p_Var5 = *(_Base_ptr *)((long)&pwVar3[uVar7].seq_id._M_t._M_impl + 0x10);
          if (p_Var5 != (_Base_ptr)0x0) {
            p_Var1 = (_Base_ptr)((long)&pwVar3[uVar7].seq_id._M_t._M_impl + 8);
            p_Var6 = p_Var1;
            do {
              if (local_34 <= (int)p_Var5[1]._M_color) {
                p_Var6 = p_Var5;
              }
              p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < local_34];
            } while (p_Var5 != (_Base_ptr)0x0);
            if ((p_Var6 != p_Var1) && ((int)p_Var6[1]._M_color <= local_34)) {
              pVar9 = std::
                      _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      ::equal_range(&pwVar3[uVar7].seq_id._M_t,&local_34);
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              _M_erase_aux(&pwVar3[uVar7].seq_id._M_t,(_Base_ptr)pVar9.first._M_node,
                           (_Base_ptr)pVar9.second._M_node);
              goto LAB_00132122;
            }
          }
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar2);
    if (uVar8 != uVar2) {
      cache->head = uVar8;
    }
  }
  return;
}

Assistant:

static void whisper_kv_cache_seq_rm(
        struct whisper_kv_cache & cache,
                 whisper_seq_id   seq_id,
                    whisper_pos   p0,
                    whisper_pos   p1) {
    uint32_t new_head = cache.size;

    if (p0 < 0) p0 = 0;
    if (p1 < 0) p1 = std::numeric_limits<whisper_pos>::max();

    for (uint32_t i = 0; i < cache.size; ++i) {
        if (cache.cells[i].pos >= p0 && cache.cells[i].pos < p1) {
            if (seq_id < 0) {
                cache.cells[i].seq_id.clear();
            } else if (cache.cells[i].has_seq_id(seq_id)) {
                cache.cells[i].seq_id.erase(seq_id);
            } else {
                continue;
            }
            if (cache.cells[i].seq_id.empty()) {
                cache.cells[i].pos = -1;
                if (new_head == cache.size) new_head = i;
            }
        }
    }

    // If we freed up a slot, set head to it so searching can start there.
    if (new_head != cache.size) cache.head = new_head;
}